

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeffects.cpp
# Opt level: O2

void __thiscall QRollEffect::run(QRollEffect *this,int time)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  long in_FS_OFFSET;
  Object local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar7 = QPointer::operator_cast_to_bool((QPointer *)&this->widget);
  if (bVar7) {
    this->duration = time;
    this->elapsed = 0;
    if (time < 0) {
      uVar1 = this->totalHeight;
      uVar3 = this->totalWidth;
      uVar2 = this->currentHeight;
      uVar4 = this->currentWidth;
      iVar8 = (int)((~-(uint)((this->orientation & 3U) == 0) & uVar3 - uVar4) +
                   (~-(uint)((this->orientation & 0xcU) == 0) & uVar1 - uVar2)) / 3;
      iVar6 = 0x32;
      if (0x32 < iVar8) {
        iVar6 = iVar8;
      }
      iVar8 = 0x78;
      if (iVar6 < 0x78) {
        iVar8 = iVar6;
      }
      this->duration = iVar8;
    }
    QObject::connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QRollEffect::*)()>
              (local_30,(offset_in_QTimer_to_subr)&this->anim,(ContextType *)QTimer::timeout,
               (offset_in_QRollEffect_to_subr *)0x0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_30);
    lVar5 = *(long *)((this->widget).wp.value + 0x20);
    QWidget::move(&this->super_QWidget,*(int *)(lVar5 + 0x14),*(int *)(lVar5 + 0x18));
    iVar6 = this->totalWidth;
    if (this->currentWidth < this->totalWidth) {
      iVar6 = this->currentWidth;
    }
    iVar8 = this->totalHeight;
    if (this->currentHeight < this->totalHeight) {
      iVar8 = this->currentHeight;
    }
    QWidget::resize(&this->super_QWidget,iVar6,iVar8);
    QWidget::setAttribute((QWidget *)(this->widget).wp.value,WA_WState_ExplicitShowHide,true);
    QWidget::setAttribute((QWidget *)(this->widget).wp.value,WA_WState_Hidden,false);
    QWidget::show(&this->super_QWidget);
    QWidget::setEnabled(&this->super_QWidget,false);
    this->done = false;
    this->showWidget = true;
    QTimer::start((int)&this->anim);
    QElapsedTimer::start();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRollEffect::run(int time)
{
    if (!widget)
        return;

    duration  = time;
    elapsed = 0;

    if (duration < 0) {
        int dist = 0;
        if (orientation & (RightScroll|LeftScroll))
            dist += totalWidth - currentWidth;
        if (orientation & (DownScroll|UpScroll))
            dist += totalHeight - currentHeight;
        duration = qMin(qMax(dist/3, 50), 120);
    }

    connect(&anim, &QTimer::timeout, this, &QRollEffect::scroll);

    move(widget->geometry().x(),widget->geometry().y());
    resize(qMin(currentWidth, totalWidth), qMin(currentHeight, totalHeight));

    //This is roughly equivalent to calling setVisible(true) without actually showing the widget
    widget->setAttribute(Qt::WA_WState_ExplicitShowHide, true);
    widget->setAttribute(Qt::WA_WState_Hidden, false);

    show();
    setEnabled(false);

    showWidget = true;
    done = false;
    anim.start(1);
    checkTime.start();
}